

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySortTree.c
# Opt level: O0

int InsertBST(BiTree *T,int key)

{
  int iVar1;
  BiTree pBVar2;
  BiTree s;
  BiTree p;
  BiTree *ppBStack_18;
  int key_local;
  BiTree *T_local;
  
  p._4_4_ = key;
  ppBStack_18 = T;
  iVar1 = SearchBST(*T,key,(BiTree)0x0,&s);
  if (iVar1 == 0) {
    pBVar2 = (BiTree)malloc(0x18);
    pBVar2->data = p._4_4_;
    pBVar2->rChlid = (BiTNode *)0x0;
    pBVar2->lChild = (BiTNode *)0x0;
    if (s == (BiTree)0x0) {
      *ppBStack_18 = pBVar2;
    }
    else if (p._4_4_ < s->data) {
      s->lChild = pBVar2;
    }
    else {
      s->rChlid = pBVar2;
    }
    T_local._4_4_ = 1;
  }
  else {
    T_local._4_4_ = 0;
  }
  return T_local._4_4_;
}

Assistant:

int InsertBST(BiTree *T,int key){
     BiTree p,s;
     if(!SearchBST(*T,key,NULL,&p)){        //没找到key
         s = (BiTree)malloc(sizeof(BiTNode));
         s->data = key;
         s->lChild = s->rChlid = NULL;  //新结点初始化

         if(!p)
             *T = s; //插入s为新的根节点
         else if(key < p->data)
             p->lChild = s;     //插入s为左孩子
         else
             p->rChlid = s;     //插入s为右孩子
         return 1;
     } else
         return 0;
 }